

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
::DestroyContents(Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                  *this)

{
  ulong uVar1;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pPVar2;
  ulong uVar3;
  
  uVar3 = (this->metadata_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  uVar1 = uVar3 & 1;
  if (uVar1 == 0) {
    pPVar2 = (Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)&this->data_;
  }
  else {
    pPVar2 = (this->data_).allocated.allocated_data;
  }
  if (1 < uVar3) {
    uVar3 = uVar3 >> 1;
    pPVar2 = pPVar2 + uVar3;
    do {
      pPVar2 = pPVar2 + -1;
      __gnu_cxx::new_allocator<absl::lts_20240722::status_internal::Payload>::
      destroy<absl::lts_20240722::status_internal::Payload>
                ((new_allocator<absl::lts_20240722::status_internal::Payload> *)this,pPVar2);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    uVar1 = (ulong)((uint)(this->metadata_).
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                          .super_Storage<unsigned_long,_1UL,_false>.value & 1);
  }
  if (uVar1 != 0) {
    operator_delete((this->data_).allocated.allocated_data,
                    (this->data_).allocated.allocated_capacity * 0x30);
    return;
  }
  return;
}

Assistant:

void Storage<T, N, A>::DestroyContents() {
  Pointer<A> data = GetIsAllocated() ? GetAllocatedData() : GetInlinedData();
  DestroyAdapter<A>::DestroyElements(GetAllocator(), data, GetSize());
  DeallocateIfAllocated();
}